

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

bool __thiscall
crnlib::vector<crnlib::vec<4U,_float>_>::try_resize
          (vector<crnlib::vec<4U,_float>_> *this,uint new_size,bool grow_hint)

{
  bool bVar1;
  byte local_29;
  bool grow_hint_local;
  uint new_size_local;
  vector<crnlib::vec<4U,_float>_> *this_local;
  
  if (this->m_size != new_size) {
    if (new_size < this->m_size) {
      scalar_type<crnlib::vec<4U,_float>_>::destruct_array
                (this->m_p + new_size,this->m_size - new_size);
    }
    else {
      if (this->m_capacity < new_size) {
        local_29 = 1;
        if (new_size != this->m_size + 1) {
          local_29 = grow_hint;
        }
        bVar1 = increase_capacity(this,new_size,(bool)(local_29 & 1),true);
        if (!bVar1) {
          return false;
        }
      }
      scalar_type<crnlib::vec<4U,_float>_>::construct_array
                (this->m_p + this->m_size,new_size - this->m_size);
    }
    this->m_size = new_size;
  }
  return true;
}

Assistant:

inline bool try_resize(uint new_size, bool grow_hint = false)
        {
            if (m_size != new_size)
            {
                if (new_size < m_size)
                {
                    scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
                }
                else
                {
                    if (new_size > m_capacity)
                    {
                        if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
                        {
                            return false;
                        }
                    }

                    scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
                }

                m_size = new_size;
            }

            return true;
        }